

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_names.cc
# Opt level: O3

bool prometheus::CheckMetricName(string *name)

{
  byte *pbVar1;
  byte bVar2;
  ulong uVar3;
  bool bVar4;
  byte *pbVar5;
  byte *pbVar6;
  long lVar7;
  
  bVar4 = anon_unknown_3::nameStartsValid(name);
  if (!bVar4) {
    return false;
  }
  pbVar6 = (byte *)(name->_M_dataplus)._M_p;
  uVar3 = name->_M_string_length;
  pbVar1 = pbVar6 + uVar3;
  pbVar5 = pbVar6;
  if (0 < (long)uVar3 >> 2) {
    pbVar5 = pbVar6 + (uVar3 & 0xfffffffffffffffc);
    lVar7 = ((long)uVar3 >> 2) + 1;
    pbVar6 = pbVar6 + 3;
    do {
      bVar2 = pbVar6[-3];
      if (((((byte)(bVar2 - 0x3a) < 0xf6) && ((byte)((bVar2 & 0xdf) + 0xa5) < 0xe6)) &&
          (bVar2 != 0x5f)) && (bVar2 != 0x3a)) {
        pbVar6 = pbVar6 + -3;
        goto LAB_0015dd4a;
      }
      bVar2 = pbVar6[-2];
      if ((((byte)(bVar2 - 0x3a) < 0xf6) && ((byte)((bVar2 & 0xdf) + 0xa5) < 0xe6)) &&
         ((bVar2 != 0x5f && (bVar2 != 0x3a)))) {
        pbVar6 = pbVar6 + -2;
        goto LAB_0015dd4a;
      }
      bVar2 = pbVar6[-1];
      if ((((byte)(bVar2 - 0x3a) < 0xf6) && ((byte)((bVar2 & 0xdf) + 0xa5) < 0xe6)) &&
         ((bVar2 != 0x5f && (bVar2 != 0x3a)))) {
        pbVar6 = pbVar6 + -1;
        goto LAB_0015dd4a;
      }
      bVar2 = *pbVar6;
      if (((((byte)(bVar2 - 0x3a) < 0xf6) && ((byte)((bVar2 & 0xdf) + 0xa5) < 0xe6)) &&
          (bVar2 != 0x5f)) && (bVar2 != 0x3a)) goto LAB_0015dd4a;
      lVar7 = lVar7 + -1;
      pbVar6 = pbVar6 + 4;
    } while (1 < lVar7);
  }
  lVar7 = (long)pbVar1 - (long)pbVar5;
  if (lVar7 != 1) {
    pbVar6 = pbVar5;
    if (lVar7 != 2) {
      pbVar6 = pbVar1;
      if ((lVar7 != 3) ||
         (((bVar2 = *pbVar5, (byte)(bVar2 - 0x3a) < 0xf6 && ((byte)((bVar2 & 0xdf) + 0xa5) < 0xe6))
          && ((bVar2 != 0x5f && (pbVar6 = pbVar5, bVar2 != 0x3a)))))) goto LAB_0015dd4a;
      pbVar6 = pbVar5 + 1;
    }
    bVar2 = *pbVar6;
    if ((((byte)(bVar2 - 0x3a) < 0xf6) && ((byte)((bVar2 & 0xdf) + 0xa5) < 0xe6)) &&
       ((bVar2 != 0x5f && (bVar2 != 0x3a)))) goto LAB_0015dd4a;
    pbVar5 = pbVar6 + 1;
  }
  bVar2 = *pbVar5;
  pbVar6 = pbVar1;
  if (((((byte)(bVar2 - 0x3a) < 0xf6) && ((byte)((bVar2 & 0xdf) + 0xa5) < 0xe6)) && (bVar2 != 0x5f))
     && (pbVar6 = pbVar5, bVar2 == 0x3a)) {
    pbVar6 = pbVar1;
  }
LAB_0015dd4a:
  return pbVar6 == pbVar1;
}

Assistant:

bool CheckMetricName(const std::string& name) {
  if (!nameStartsValid(name)) {
    return false;
  }

  auto validMetricCharacters = [](char c) {
    return isLocaleIndependentAlphaNumeric(c) || c == '_' || c == ':';
  };

  auto mismatch =
      std::find_if_not(std::begin(name), std::end(name), validMetricCharacters);
  return mismatch == std::end(name);
}